

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlTextReaderLocalName(void)

{
  int iVar1;
  int iVar2;
  xmlTextReaderPtr val;
  xmlChar *val_00;
  int local_24;
  int n_reader;
  xmlTextReaderPtr reader;
  xmlChar *ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    iVar1 = xmlMemBlocks();
    val = gen_xmlTextReaderPtr(local_24,0);
    val_00 = (xmlChar *)xmlTextReaderLocalName(val);
    desret_xmlChar_ptr(val_00);
    call_tests = call_tests + 1;
    des_xmlTextReaderPtr(local_24,val,0);
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderLocalName",(ulong)(uint)(iVar2 - iVar1));
      ret_val._4_4_ = ret_val._4_4_ + 1;
      printf(" %d");
      printf("\n");
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlTextReaderLocalName(void) {
    int test_ret = 0;

#if defined(LIBXML_READER_ENABLED)
    int mem_base;
    xmlChar * ret_val;
    xmlTextReaderPtr reader; /* the xmlTextReaderPtr used */
    int n_reader;

    for (n_reader = 0;n_reader < gen_nb_xmlTextReaderPtr;n_reader++) {
        mem_base = xmlMemBlocks();
        reader = gen_xmlTextReaderPtr(n_reader, 0);

        ret_val = xmlTextReaderLocalName(reader);
        desret_xmlChar_ptr(ret_val);
        call_tests++;
        des_xmlTextReaderPtr(n_reader, reader, 0);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlTextReaderLocalName",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_reader);
            printf("\n");
        }
    }
    function_tests++;
#endif

    return(test_ret);
}